

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O2

string * despot::lower(string *__return_storage_ptr__,string *str)

{
  char cVar1;
  int i;
  ulong uVar2;
  locale loc;
  locale local_20 [8];
  
  std::locale::locale(local_20);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)str);
  for (uVar2 = 0; uVar2 < __return_storage_ptr__->_M_string_length; uVar2 = uVar2 + 1) {
    cVar1 = std::tolower<char>((__return_storage_ptr__->_M_dataplus)._M_p[uVar2],local_20);
    (__return_storage_ptr__->_M_dataplus)._M_p[uVar2] = cVar1;
  }
  std::locale::~locale(local_20);
  return __return_storage_ptr__;
}

Assistant:

inline std::string lower(std::string str) {
  std::locale loc;
	std::string copy = str;
	for (int i = 0; i < copy.length(); i++)
		copy[i] = std::tolower(copy[i], loc);
	return copy;
}